

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O2

Orphan<capnproto_test::capnp::test::TestAllTypes> * __thiscall
capnp::Orphan<capnp::DynamicValue>::releaseAs<capnproto_test::capnp::test::TestAllTypes>
          (Orphan<capnproto_test::capnp::test::TestAllTypes> *__return_storage_ptr__,
          Orphan<capnp::DynamicValue> *this)

{
  Builder local_80;
  Builder local_40;
  
  get(&local_80,this);
  DynamicValue::Builder::AsImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            (&local_40,&local_80);
  DynamicValue::Builder::~Builder(&local_80);
  this->type = UNKNOWN;
  capnp::_::OrphanBuilder::OrphanBuilder(&__return_storage_ptr__->builder,&this->builder);
  return __return_storage_ptr__;
}

Assistant:

Orphan<T> Orphan<DynamicValue>::releaseAs() {
  get().as<T>();  // type check
  type = DynamicValue::UNKNOWN;
  return Orphan<T>(kj::mv(builder));
}